

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reader_test.cc
# Opt level: O2

void xLearn::CheckLR(DMatrix *matrix,bool has_label,bool disk)

{
  vector<xLearn::Node,_std::allocator<xLearn::Node>_> *pvVar1;
  undefined7 in_register_00000011;
  char *pcVar2;
  pointer expected;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_68;
  AssertHelper local_60;
  AssertionResult gtest_ar;
  int n;
  DMatrix *local_40;
  ulong local_38;
  
  if ((int)CONCAT71(in_register_00000011,disk) == 0) {
    testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
              ((internal *)&gtest_ar,"matrix->row_length","kNumLines",&matrix->row_length,&kNumLines
              );
    if (gtest_ar.success_ == false) {
      testing::Message::Message((Message *)&local_68);
      if (gtest_ar.message_.ptr_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar2 = "";
      }
      else {
        pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_60,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/aksnzhy[P]xlearn/src/reader/reader_test.cc"
                 ,0x8e,pcVar2);
      testing::internal::AssertHelper::operator=(&local_60,(Message *)&local_68);
      goto LAB_00125e49;
    }
  }
  else {
    testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
              ((internal *)&gtest_ar,"matrix->row_length","kNumLines",&matrix->row_length,&kNumLines
              );
    if (gtest_ar.success_ == false) {
      testing::Message::Message((Message *)&local_68);
      if (gtest_ar.message_.ptr_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar2 = "";
      }
      else {
        pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_60,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/aksnzhy[P]xlearn/src/reader/reader_test.cc"
                 ,0x8c,pcVar2);
      testing::internal::AssertHelper::operator=(&local_60,(Message *)&local_68);
LAB_00125e49:
      testing::internal::AssertHelper::~AssertHelper(&local_60);
      testing::internal::
      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~scoped_ptr(&local_68);
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  if (has_label) {
    local_68.ptr_._0_4_ = 0;
    testing::internal::CmpHelperEQ<float,int>
              ((internal *)&gtest_ar,"matrix->Y[0]","0",
               (matrix->Y).super__Vector_base<float,_std::allocator<float>_>._M_impl.
               super__Vector_impl_data._M_start,(int *)&local_68);
    if (gtest_ar.success_ != false) goto LAB_00125f68;
    testing::Message::Message((Message *)&local_68);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_60,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/aksnzhy[P]xlearn/src/reader/reader_test.cc"
               ,0x92,pcVar2);
    testing::internal::AssertHelper::operator=(&local_60,(Message *)&local_68);
  }
  else {
    local_68.ptr_._0_4_ = 0xfffffffe;
    testing::internal::CmpHelperEQ<float,int>
              ((internal *)&gtest_ar,"matrix->Y[0]","-2",
               (matrix->Y).super__Vector_base<float,_std::allocator<float>_>._M_impl.
               super__Vector_impl_data._M_start,(int *)&local_68);
    if (gtest_ar.success_ != false) goto LAB_00125f68;
    testing::Message::Message((Message *)&local_68);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_60,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/aksnzhy[P]xlearn/src/reader/reader_test.cc"
               ,0x94,pcVar2);
    testing::internal::AssertHelper::operator=(&local_60,(Message *)&local_68);
  }
  testing::internal::AssertHelper::~AssertHelper(&local_60);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~scoped_ptr(&local_68);
LAB_00125f68:
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  testing::internal::CmpHelperFloatingPointEQ<float>
            ((internal *)&gtest_ar,"matrix->norm[0]","22.03274",
             *(matrix->norm).super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_start,22.03274);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_68);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_60,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/aksnzhy[P]xlearn/src/reader/reader_test.cc"
               ,0x96,pcVar2);
    testing::internal::AssertHelper::operator=(&local_60,(Message *)&local_68);
    testing::internal::AssertHelper::~AssertHelper(&local_60);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr(&local_68);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  local_40 = matrix;
  for (local_38 = 0; local_38 < matrix->row_length; local_38 = local_38 + 1) {
    pvVar1 = (matrix->row).
             super__Vector_base<std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_*,_std::allocator<std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_*>_>
             ._M_impl.super__Vector_impl_data._M_start[local_38];
    n = 0;
    for (expected = (pvVar1->super__Vector_base<xLearn::Node,_std::allocator<xLearn::Node>_>).
                    _M_impl.super__Vector_impl_data._M_start;
        expected !=
        *(pointer *)
         ((long)&(pvVar1->super__Vector_base<xLearn::Node,_std::allocator<xLearn::Node>_>)._M_impl.
                 super__Vector_impl_data + 8); expected = expected + 1) {
      local_68.ptr_._0_4_ = 0;
      testing::internal::CmpHelperEQ<unsigned_int,int>
                ((internal *)&gtest_ar,"iter->field_id","0",&expected->field_id,(int *)&local_68);
      if (gtest_ar.success_ == false) {
        testing::Message::Message((Message *)&local_68);
        pcVar2 = "";
        if (gtest_ar.message_.ptr_ !=
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_60,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/aksnzhy[P]xlearn/src/reader/reader_test.cc"
                   ,0x9c,pcVar2);
        testing::internal::AssertHelper::operator=(&local_60,(Message *)&local_68);
        testing::internal::AssertHelper::~AssertHelper(&local_60);
        testing::internal::
        scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~scoped_ptr(&local_68);
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~scoped_ptr(&gtest_ar.message_);
      local_68.ptr_._0_4_ = 1;
      testing::internal::CmpHelperEQ<unsigned_int,int>
                ((internal *)&gtest_ar,"iter->feat_id","1",&expected->feat_id,(int *)&local_68);
      if (gtest_ar.success_ == false) {
        testing::Message::Message((Message *)&local_68);
        pcVar2 = "";
        if (gtest_ar.message_.ptr_ !=
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_60,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/aksnzhy[P]xlearn/src/reader/reader_test.cc"
                   ,0x9d,pcVar2);
        testing::internal::AssertHelper::operator=(&local_60,(Message *)&local_68);
        testing::internal::AssertHelper::~AssertHelper(&local_60);
        testing::internal::
        scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~scoped_ptr(&local_68);
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~scoped_ptr(&gtest_ar.message_);
      testing::internal::CmpHelperFloatingPointEQ<float>
                ((internal *)&gtest_ar,"iter->feat_val","0.123",expected->feat_val,0.123);
      if (gtest_ar.success_ == false) {
        testing::Message::Message((Message *)&local_68);
        pcVar2 = "";
        if (gtest_ar.message_.ptr_ !=
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_60,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/aksnzhy[P]xlearn/src/reader/reader_test.cc"
                   ,0x9e,pcVar2);
        testing::internal::AssertHelper::operator=(&local_60,(Message *)&local_68);
        testing::internal::AssertHelper::~AssertHelper(&local_60);
        testing::internal::
        scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~scoped_ptr(&local_68);
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~scoped_ptr(&gtest_ar.message_);
      n = n + 1;
    }
    local_68.ptr_._0_4_ = 3;
    testing::internal::CmpHelperEQ<int,int>((internal *)&gtest_ar,"n","3",&n,(int *)&local_68);
    matrix = local_40;
    if (gtest_ar.success_ == false) {
      testing::Message::Message((Message *)&local_68);
      pcVar2 = "";
      if (gtest_ar.message_.ptr_ !=
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_60,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/aksnzhy[P]xlearn/src/reader/reader_test.cc"
                 ,0xa1,pcVar2);
      testing::internal::AssertHelper::operator=(&local_60,(Message *)&local_68);
      testing::internal::AssertHelper::~AssertHelper(&local_60);
      testing::internal::
      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~scoped_ptr(&local_68);
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar.message_);
  }
  return;
}

Assistant:

void CheckLR(const DMatrix* matrix, bool has_label, bool disk) {
  if (disk) {
    EXPECT_EQ(matrix->row_length, kNumLines);
  } else {
    EXPECT_EQ(matrix->row_length, kNumLines);
  }
  // check the first element
  if (has_label) {
    EXPECT_EQ(matrix->Y[0], 0);
  } else {
    EXPECT_EQ(matrix->Y[0], -2);
  }
  EXPECT_FLOAT_EQ(matrix->norm[0], 22.03274);
  for (int i = 0; i < matrix->row_length; ++i) {
    SparseRow *row = matrix->row[i];
    int n = 0;
    for (SparseRow::iterator iter = row->begin();
         iter != row->end(); ++iter) {
      EXPECT_EQ(iter->field_id, 0);
      EXPECT_EQ(iter->feat_id, 1);
      EXPECT_FLOAT_EQ(iter->feat_val, 0.123);
      n++;
    }
    EXPECT_EQ(n, 3);
  }
}